

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall
spdlog::details::T_formatter<spdlog::details::null_scoped_padder>::format
          (T_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  char local_1a [2];
  
  fmt_helper::pad2(tm_time->tm_hour,dest);
  local_1a[1] = 0x3a;
  ::fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_1a + 1);
  fmt_helper::pad2(tm_time->tm_min,dest);
  local_1a[0] = ':';
  ::fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_1a);
  fmt_helper::pad2(tm_time->tm_sec,dest);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 8;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
    }